

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

void cppwinrt::get_interfaces_impl
               (writer *w,get_interfaces_t *result,bool defaulted,bool overridable,bool base,
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *generic_param_stack,
               pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> *children)

{
  pointer pvVar1;
  long lVar2;
  undefined1 auVar3 [12];
  undefined8 uVar4;
  pointer pvVar5;
  table_base *ptVar6;
  pointer pTVar7;
  vector<std::pair<std::__cxx11::string,cppwinrt::interface_info>,std::allocator<std::pair<std::__cxx11::string,cppwinrt::interface_info>>>
  *this;
  interface_info *piVar8;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  pointer args;
  pointer pcVar9;
  bool bVar10;
  bool bVar11;
  CustomAttribute CVar12;
  TypeDef TVar13;
  InterfaceImpl __begin1;
  GenericTypeInstSig signature;
  TypeSpecSig type_signature;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 local_170 [32];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  vStack_150;
  InterfaceImpl local_138;
  undefined4 local_124;
  uint32_t local_120;
  undefined4 local_11c;
  undefined1 local_118 [80];
  pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> local_c8;
  vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_> local_a8;
  vector<std::pair<std::__cxx11::string,cppwinrt::interface_info>,std::allocator<std::pair<std::__cxx11::string,cppwinrt::interface_info>>>
  *local_90;
  string_view local_88;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_40;
  table_base *local_38;
  
  local_124 = (undefined4)CONCAT71(in_register_00000009,overridable);
  local_11c = (undefined4)CONCAT71(in_register_00000011,defaulted);
  local_138.super_row_base<winmd::reader::InterfaceImpl>.m_table =
       (children->first).super_row_base<winmd::reader::InterfaceImpl>.m_table;
  uVar4._0_4_ = (children->first).super_row_base<winmd::reader::InterfaceImpl>.m_index;
  uVar4._4_4_ = *(undefined4 *)
                 &(children->first).super_row_base<winmd::reader::InterfaceImpl>.field_0xc;
  local_38 = (children->second).super_row_base<winmd::reader::InterfaceImpl>.m_table;
  local_120 = (children->second).super_row_base<winmd::reader::InterfaceImpl>.m_index;
  if ((uint32_t)uVar4 != local_120 ||
      local_138.super_row_base<winmd::reader::InterfaceImpl>.m_table != local_38) {
    local_138.super_row_base<winmd::reader::InterfaceImpl>._8_8_ = uVar4;
    local_90 = (vector<std::pair<std::__cxx11::string,cppwinrt::interface_info>,std::allocator<std::pair<std::__cxx11::string,cppwinrt::interface_info>>>
                *)result;
    local_40 = generic_param_stack;
    do {
      ptVar6 = local_138.super_row_base<winmd::reader::InterfaceImpl>.m_table;
      local_170._0_8_ = (table_base *)0x0;
      local_170._8_4_ = 0;
      local_170[0x10] = false;
      local_170[0x11] = false;
      local_170[0x12] = false;
      local_170[0x13] = false;
      local_170[0x14] = false;
      local_170[0x15] = false;
      vStack_150.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_150.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_170._24_4_ = 0;
      local_170._28_4_ = 0;
      vStack_150.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_118._72_4_ =
           winmd::reader::table_base::get_value<unsigned_int>
                     (local_138.super_row_base<winmd::reader::InterfaceImpl>.m_table,(uint32_t)uVar4
                      ,1);
      local_c8.first.super_row_base<winmd::reader::InterfaceImpl>.m_table = (table_base *)0x1;
      local_c8.first.super_row_base<winmd::reader::InterfaceImpl>.m_index = 0x1b4a13;
      local_c8.first.super_row_base<winmd::reader::InterfaceImpl>._12_4_ = 0;
      local_118._64_8_ = ptVar6;
      writer_base<cppwinrt::writer>::
      write_temp<winmd::reader::coded_index<winmd::reader::TypeDefOrRef>>
                (&local_78,&w->super_writer_base<cppwinrt::writer>,(string_view *)&local_c8,
                 (coded_index<winmd::reader::TypeDefOrRef> *)(local_118 + 0x40));
      local_c8.first.super_row_base<winmd::reader::InterfaceImpl>.m_table = (table_base *)0x1b;
      local_c8.first.super_row_base<winmd::reader::InterfaceImpl>.m_index = 0x176ad2;
      local_c8.first.super_row_base<winmd::reader::InterfaceImpl>._12_4_ = 0;
      local_118._0_8_ = (pointer)0x10;
      local_118._8_4_ = 0x176aee;
      local_118._12_4_ = 0;
      CVar12 = winmd::reader::get_attribute<winmd::reader::InterfaceImpl>
                         (&local_138,(string_view *)&local_c8,(string_view *)local_118);
      bVar10 = CVar12.super_row_base<winmd::reader::CustomAttribute>.m_table != (table_base *)0x0;
      bVar11 = (char)local_11c != '\0';
      local_170[0x11] = !base && (bVar11 || bVar10);
      local_170[0x10] = bVar10;
      piVar8 = find(*(get_interfaces_t **)local_90,(string_view *)*(pointer *)(local_90 + 8));
      if ((piVar8 == (interface_info *)0x0) ||
         ((piVar8->defaulted == false && (!base && (bVar11 || bVar10))))) {
        bVar10 = true;
        if ((char)local_124 == '\0') {
          local_c8.first.super_row_base<winmd::reader::InterfaceImpl>.m_table = (table_base *)0x1b;
          local_c8.first.super_row_base<winmd::reader::InterfaceImpl>.m_index = 0x176ad2;
          local_c8.first.super_row_base<winmd::reader::InterfaceImpl>._12_4_ = 0;
          local_118._0_8_ = (pointer)0x14;
          local_118._8_4_ = 0x176aff;
          local_118._12_4_ = 0;
          CVar12 = winmd::reader::get_attribute<winmd::reader::InterfaceImpl>
                             (&local_138,(string_view *)&local_c8,(string_view *)local_118);
          bVar10 = CVar12.super_row_base<winmd::reader::CustomAttribute>.m_table !=
                   (table_base *)0x0;
        }
        local_170[0x12] = bVar10;
        local_170[0x13] = base;
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator=(&vStack_150,local_40);
        switch(local_118._72_4_ & 3) {
        case 0:
          local_170._0_8_ = *(long *)local_118._64_8_ + 0x78;
          local_170._8_4_ = ((uint)local_118._72_4_ >> 2) - 1;
          break;
        case 1:
          local_c8.first.super_row_base<winmd::reader::InterfaceImpl>.m_table =
               *(table_base **)local_118._64_8_;
          local_c8.first.super_row_base<winmd::reader::InterfaceImpl>.m_index =
               ((uint)local_118._72_4_ >> 2) - 1;
          TVar13 = winmd::reader::find_required((TypeRef *)&local_c8);
          local_170._0_8_ = TVar13.super_row_base<winmd::reader::TypeDef>.m_table;
          local_170._8_4_ = TVar13.super_row_base<winmd::reader::TypeDef>.m_index;
          writer::add_depends(w,(TypeDef *)local_170);
          break;
        case 2:
          local_118._0_8_ = *(long *)local_118._64_8_ + 0x50;
          local_118._8_4_ = ((uint)local_118._72_4_ >> 2) - 1;
          winmd::reader::TypeSpec::Signature((TypeSpecSig *)&local_c8,(TypeSpec *)local_118);
          pTVar7 = local_a8.
                   super__Vector_base<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_58.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_58.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_58.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (args = local_a8.
                      super__Vector_base<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>
                      ._M_impl.super__Vector_impl_data._M_start; args != pTVar7; args = args + 1) {
            local_88._M_len = 1;
            local_88._M_str = "%";
            writer_base<cppwinrt::writer>::write_temp<winmd::reader::TypeSig>
                      ((string *)local_118,&w->super_writer_base<cppwinrt::writer>,&local_88,args);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118);
            if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
              operator_delete((void *)local_118._0_8_,
                              CONCAT44(local_118._20_4_,local_118._16_4_) + 1);
            }
          }
          std::
          vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      *)&vStack_150,&local_58);
          writer::push_generic_params((writer *)local_118,(GenericTypeInstSig *)w);
          pcVar9 = (pointer)local_118._0_8_;
          local_118._16_4_ =
               (_Rb_tree_color)local_c8.second.super_row_base<winmd::reader::InterfaceImpl>.m_table;
          local_118._20_4_ =
               local_c8.second.super_row_base<winmd::reader::InterfaceImpl>.m_table._4_4_;
          local_118._0_8_ = local_c8.first.super_row_base<winmd::reader::InterfaceImpl>.m_table;
          local_118._8_4_ = local_c8.first.super_row_base<winmd::reader::InterfaceImpl>.m_index;
          local_118._12_4_ = local_c8.first.super_row_base<winmd::reader::InterfaceImpl>._12_4_;
          std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>::vector
                    ((vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_> *)
                     (local_118 + 0x20),&local_a8);
          if ((local_118._16_4_ & 3) == _S_red) {
            auVar3._8_4_ = ((uint)local_118._16_4_ >> 2) - 1;
            auVar3._0_8_ = *(long *)CONCAT44(local_118._12_4_,local_118._8_4_) + 0x78;
          }
          else if ((local_118._16_4_ & 3) == _S_black) {
            local_88._M_len = *(long *)CONCAT44(local_118._12_4_,local_118._8_4_);
            local_88._M_str =
                 (char *)CONCAT44(local_88._M_str._4_4_,((uint)local_118._16_4_ >> 2) - 1);
            TVar13 = winmd::reader::find_required((TypeRef *)&local_88);
            auVar3 = TVar13.super_row_base<winmd::reader::TypeDef>._0_12_;
          }
          else {
            auVar3 = ZEXT412(0) << 0x40;
          }
          local_170._0_8_ = auVar3._0_8_;
          local_170._8_4_ = auVar3._8_4_;
          std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>::~vector
                    ((vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_> *)
                     (local_118 + 0x20));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_58);
          std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>::~vector
                    (&local_a8);
          goto LAB_0010fbc2;
        }
        pcVar9 = (pointer)0x0;
LAB_0010fbc2:
        local_c8.first.super_row_base<winmd::reader::InterfaceImpl>.m_table = (table_base *)0x1b;
        local_c8.first.super_row_base<winmd::reader::InterfaceImpl>.m_index = 0x176ad2;
        local_c8.first.super_row_base<winmd::reader::InterfaceImpl>._12_4_ = 0;
        local_118._0_8_ = (pointer)0x14;
        local_118._8_4_ = 0x176b14;
        local_118._12_4_ = 0;
        CVar12 = winmd::reader::get_attribute<winmd::reader::TypeDef>
                           ((TypeDef *)local_170,(string_view *)&local_c8,(string_view *)local_118);
        bVar11 = local_170[0x12];
        bVar10 = local_170[0x11];
        local_170[0x14] =
             CVar12.super_row_base<winmd::reader::CustomAttribute>.m_table != (table_base *)0x0;
        local_118._0_4_ = local_170._8_4_ + 1;
        winmd::reader::
        equal_range<winmd::reader::table<winmd::reader::InterfaceImpl>,unsigned_int,winmd::reader::TypeDef::InterfaceImpl()const::compare>
                  (&local_c8,(reader *)&(*(database **)local_170._0_8_)->InterfaceImpl,
                   (writer *)local_118);
        this = local_90;
        get_interfaces_impl(w,(get_interfaces_t *)local_90,bVar10,bVar11,base,&vStack_150,&local_c8)
        ;
        local_118._0_8_ = local_78._M_string_length;
        local_118._8_4_ = SUB84(local_78._M_dataplus._M_p,0);
        local_118._12_4_ = (undefined4)((ulong)local_78._M_dataplus._M_p >> 0x20);
        piVar8 = find(*(get_interfaces_t **)this,*(string_view **)(this + 8));
        if (piVar8 == (interface_info *)0x0) {
          std::
          vector<std::pair<std::__cxx11::string,cppwinrt::interface_info>,std::allocator<std::pair<std::__cxx11::string,cppwinrt::interface_info>>>
          ::
          emplace_back<std::basic_string_view<char,std::char_traits<char>>const&,cppwinrt::interface_info>
                    (this,(basic_string_view<char,_std::char_traits<char>_> *)local_118,
                     (interface_info *)local_170);
        }
        else {
          *(ulong *)&(piVar8->type).super_row_base<winmd::reader::TypeDef>.field_0xe =
               CONCAT17(local_170[0x15],
                        CONCAT16(local_170[0x14],
                                 CONCAT15(local_170[0x13],
                                          CONCAT14(local_170[0x12],
                                                   CONCAT13(local_170[0x11],
                                                            CONCAT12(local_170[0x10],
                                                                     local_170._14_2_))))));
          (piVar8->type).super_row_base<winmd::reader::TypeDef>.m_table =
               (table_base *)local_170._0_8_;
          *(ulong *)&(piVar8->type).super_row_base<winmd::reader::TypeDef>.m_index =
               CONCAT26(local_170._14_2_,CONCAT24(local_170._12_2_,local_170._8_4_));
          (piVar8->relative_version).first = local_170._24_4_;
          (piVar8->relative_version).second = local_170._28_4_;
          pvVar1 = (piVar8->generic_param_stack).
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_c8.first.super_row_base<winmd::reader::InterfaceImpl>.m_table =
               (table_base *)
               (piVar8->generic_param_stack).
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          pvVar5 = (piVar8->generic_param_stack).
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          (piVar8->generic_param_stack).
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               vStack_150.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          (piVar8->generic_param_stack).
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               vStack_150.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (piVar8->generic_param_stack).
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               vStack_150.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_c8.first.super_row_base<winmd::reader::InterfaceImpl>.m_index = (uint32_t)pvVar5;
          local_c8.first.super_row_base<winmd::reader::InterfaceImpl>._12_4_ =
               SUB84((ulong)pvVar5 >> 0x20,0);
          local_c8.second.super_row_base<winmd::reader::InterfaceImpl>.m_table._0_4_ =
               (_Rb_tree_color)pvVar1;
          local_c8.second.super_row_base<winmd::reader::InterfaceImpl>.m_table._4_4_ =
               (undefined4)((ulong)pvVar1 >> 0x20);
          vStack_150.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_150.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_150.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&local_c8);
        }
        if (pcVar9 != (pointer)0x0) {
          lVar2 = *(long *)(pcVar9 + 0x90);
          *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            **)(pcVar9 + 0x90) =
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(lVar2 + -0x18);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(lVar2 + -0x18));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&vStack_150);
      uVar4._0_4_ = local_138.super_row_base<winmd::reader::InterfaceImpl>.m_index + 1;
      local_138.super_row_base<winmd::reader::InterfaceImpl>.m_index = (uint32_t)uVar4;
    } while ((uint32_t)uVar4 != local_120 ||
             local_138.super_row_base<winmd::reader::InterfaceImpl>.m_table != local_38);
  }
  return;
}

Assistant:

static void get_interfaces_impl(writer& w, get_interfaces_t& result, bool defaulted, bool overridable, bool base, std::vector<std::vector<std::string>> const& generic_param_stack, std::pair<InterfaceImpl, InterfaceImpl>&& children)
    {
        for (auto&& impl : children)
        {
            interface_info info;
            auto type = impl.Interface();
            auto name = w.write_temp("%", type);
            info.is_default = has_attribute(impl, "Windows.Foundation.Metadata", "DefaultAttribute");
            info.defaulted = !base && (defaulted || info.is_default);

            {
                // This is for correctness rather than an optimization (but helps performance as well).
                // If the interface was not previously inserted, carry on and recursively insert it.
                // If a previous insertion was defaulted we're done as it is correctly captured.
                // If a newly discovered instance of a previous insertion is not defaulted, we're also done.
                // If it was previously captured as non-defaulted but now found as defaulted, we carry on and
                // rediscover it as we need it to be defaulted recursively.

                if (auto found = find(result, name))
                {
                    if (found->defaulted || !info.defaulted)
                    {
                        continue;
                    }
                }
            }

            info.overridable = overridable || has_attribute(impl, "Windows.Foundation.Metadata", "OverridableAttribute");
            info.base = base;
            info.generic_param_stack = generic_param_stack;
            writer::generic_param_guard guard;

            switch (type.type())
            {
                case TypeDefOrRef::TypeDef:
                {
                    info.type = type.TypeDef();
                    break;
                }
                case TypeDefOrRef::TypeRef:
                {
                    info.type = find_required(type.TypeRef());
                    w.add_depends(info.type);
                    break;
                }
                case TypeDefOrRef::TypeSpec:
                {
                    auto type_signature = type.TypeSpec().Signature();

                    std::vector<std::string> names;

                    for (auto&& arg : type_signature.GenericTypeInst().GenericArgs())
                    {
                        names.push_back(w.write_temp("%", arg));
                    }

                    info.generic_param_stack.push_back(std::move(names));

                    guard = w.push_generic_params(type_signature.GenericTypeInst());
                    auto signature = type_signature.GenericTypeInst();
                    info.type = find_required(signature.GenericType());

                    break;
                }
            }

            info.exclusive = has_attribute(info.type, "Windows.Foundation.Metadata", "ExclusiveToAttribute");
            get_interfaces_impl(w, result, info.defaulted, info.overridable, base, info.generic_param_stack, info.type.InterfaceImpl());
            insert_or_assign(result, name, std::move(info));
        }
    }